

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void __thiscall
wasm::TypeBuilder::setDescriptor(TypeBuilder *this,size_t i,optional<wasm::HeapType> desc)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  long lVar2;
  HeapTypeInfo *pHVar3;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  lVar2 = *(long *)&((_Var1._M_head_impl)->entries).
                    super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
  ;
  if (i < (ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) - lVar2 >> 4)) {
    lVar2 = *(long *)(lVar2 + i * 0x10);
    if (((undefined1  [16])
         desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) ==
        (undefined1  [16])0x0) {
      pHVar3 = (HeapTypeInfo *)0x0;
    }
    else {
      pHVar3 = anon_unknown_0::getHeapTypeInfo
                         (desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value);
    }
    *(HeapTypeInfo **)(lVar2 + 0x10) = pHVar3;
    return;
  }
  __assert_fail("i < size() && \"index out of bounds\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x927,"void wasm::TypeBuilder::setDescriptor(size_t, std::optional<HeapType>)");
}

Assistant:

void TypeBuilder::setDescriptor(size_t i, std::optional<HeapType> desc) {
  assert(i < size() && "index out of bounds");
  HeapTypeInfo* info = impl->entries[i].info.get();
  info->descriptor = desc ? getHeapTypeInfo(*desc) : nullptr;
}